

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O1

void __thiscall
MarkerIndex::Iterator::find_ending_in(Iterator *this,Point *start,Point *end,MarkerIdSet *result)

{
  uint *puVar1;
  bool bVar2;
  const_iterator i;
  uint *puVar3;
  Node *local_40;
  Point local_38;
  
  reset(this);
  if ((this->current_node != (Node *)0x0) &&
     (seek_to_first_node_greater_than_or_equal_to(this,start), this->current_node != (Node *)0x0)) {
    do {
      bVar2 = Point::operator<=(&this->current_node_position,end);
      if (!bVar2) {
        return;
      }
      puVar1 = (this->current_node->end_marker_ids).contents.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar3 = (this->current_node->end_marker_ids).contents.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
        flat_set<unsigned_int>::insert(result,*puVar3);
      }
      local_40 = this->current_node;
      local_38 = this->current_node_position;
      std::
      _Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<MarkerIndex::Node_const*const,Point>>
                ((_Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->marker_index->node_position_cache,&local_40);
      move_to_successor(this);
    } while (this->current_node != (Node *)0x0);
  }
  return;
}

Assistant:

void MarkerIndex::Iterator::find_ending_in(const Point &start, const Point &end, MarkerIdSet *result) {
  reset();

  if (!current_node) return;

  seek_to_first_node_greater_than_or_equal_to(start);

  while (current_node && current_node_position <= end) {
    result->insert(current_node->end_marker_ids.begin(), current_node->end_marker_ids.end());
    cache_node_position();
    move_to_successor();
  }
}